

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::clearSolvingData(Statistics *this)

{
  cpp_dec_float<200U,_int,_void> *in_RDI;
  long_long_type in_stack_ffffffffffffff08;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc [3];
  undefined4 *local_c0;
  uint *local_b8;
  undefined4 *local_b0;
  uint *local_a8;
  undefined4 *local_a0;
  uint *local_98;
  undefined4 *local_90;
  uint *local_88;
  undefined4 *local_80;
  uint *local_78;
  undefined4 *local_70;
  uint *local_68;
  undefined4 *local_60;
  uint *local_58;
  undefined4 *local_50;
  uint *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 2) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 4) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 6) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 8) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 10) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 0xc) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 0xe) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 0x10) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 0x12) + 0x10))();
  (**(code **)(**(long **)((in_RDI->data)._M_elems + 0x14) + 0x10))();
  (in_RDI->data)._M_elems[0x18] = 0;
  (in_RDI->data)._M_elems[0x19] = 0;
  (in_RDI->data)._M_elems[0x1a] = 0;
  (in_RDI->data)._M_elems[0x1b] = 0;
  in_RDI->exp = 0;
  in_RDI->neg = false;
  *(undefined3 *)&in_RDI->field_0x75 = 0;
  in_RDI->fpclass = cpp_dec_float_finite;
  in_RDI->prec_elem = 0;
  in_RDI[1].data._M_elems[0] = 0;
  in_RDI[1].data._M_elems[1] = 0;
  in_RDI[1].data._M_elems[2] = 0;
  in_RDI[1].data._M_elems[3] = 0;
  in_RDI[1].data._M_elems[4] = 0;
  in_RDI[1].data._M_elems[5] = 0;
  in_RDI[1].data._M_elems[6] = 0;
  in_RDI[1].data._M_elems[7] = 0;
  in_RDI[1].data._M_elems[8] = 0;
  in_RDI[1].data._M_elems[9] = 0;
  in_RDI[1].data._M_elems[10] = 0;
  in_RDI[1].data._M_elems[0xb] = 0;
  in_RDI[1].data._M_elems[0xc] = 0;
  in_RDI[1].data._M_elems[0xd] = 0;
  in_RDI[1].data._M_elems[0xe] = 0;
  in_RDI[1].data._M_elems[0xf] = 0;
  in_RDI[1].data._M_elems[0x10] = 0;
  in_RDI[1].data._M_elems[0x11] = 0;
  in_RDI[1].data._M_elems[0x12] = 0;
  in_RDI[1].data._M_elems[0x13] = 0;
  in_RDI[1].data._M_elems[0x14] = 0;
  in_RDI[1].data._M_elems[0x15] = 0;
  in_RDI[1].data._M_elems[0x16] = 0;
  in_RDI[1].data._M_elems[0x17] = 0;
  in_RDI[1].data._M_elems[0x18] = 0;
  in_RDI[1].data._M_elems[0x19] = 0;
  in_RDI[1].data._M_elems[0x1a] = 0;
  in_RDI[1].data._M_elems[0x1b] = 0;
  in_RDI[1].exp = 0;
  *(undefined4 *)&in_RDI[1].neg = 0;
  in_RDI[1].fpclass = cpp_dec_float_finite;
  in_RDI[1].prec_elem = 0;
  in_RDI[2].data._M_elems[0] = 0;
  in_RDI[2].data._M_elems[1] = 0;
  in_RDI[2].data._M_elems[2] = 0;
  in_RDI[2].data._M_elems[3] = 0;
  in_RDI[2].data._M_elems[4] = 0;
  in_RDI[2].data._M_elems[5] = 0;
  in_RDI[2].data._M_elems[6] = 0;
  in_RDI[2].data._M_elems[7] = 0;
  in_RDI[2].data._M_elems[8] = 0;
  in_RDI[2].data._M_elems[9] = 0;
  in_RDI[2].data._M_elems[10] = 0;
  in_RDI[2].data._M_elems[0xb] = 0;
  in_RDI[2].data._M_elems[0xc] = 0;
  in_RDI[2].data._M_elems[0xd] = 0;
  in_RDI[2].data._M_elems[0xe] = 0;
  in_RDI[2].data._M_elems[0xf] = 0;
  in_RDI[2].data._M_elems[0x10] = 0;
  local_cc[0] = 0;
  local_48 = in_RDI[2].data._M_elems + 0x11;
  local_50 = local_cc;
  local_40 = local_50;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_d0 = 0;
  local_58 = in_RDI[3].data._M_elems + 0x11;
  local_60 = &local_d0;
  local_38 = local_60;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_d4 = 0;
  local_68 = in_RDI[4].data._M_elems + 0x11;
  local_70 = &local_d4;
  local_30 = local_70;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_d8 = 0;
  local_78 = in_RDI[5].data._M_elems + 0x11;
  local_80 = &local_d8;
  local_28 = local_80;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_dc = 0;
  local_88 = in_RDI[6].data._M_elems + 0x11;
  local_90 = &local_dc;
  local_20 = local_90;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_e0 = 0;
  local_98 = in_RDI[7].data._M_elems + 0x11;
  local_a0 = &local_e0;
  local_18 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  in_RDI[8].data._M_elems[0x11] = 0;
  in_RDI[8].data._M_elems[0x12] = 0;
  local_e4 = 0;
  local_a8 = in_RDI[8].data._M_elems + 0x13;
  local_b0 = &local_e4;
  local_10 = local_b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  local_e8 = 0;
  local_b8 = in_RDI[9].data._M_elems + 0x13;
  local_c0 = &local_e8;
  local_8 = local_c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,in_stack_ffffffffffffff08);
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::clearSolvingData()
{
   solvingTime->reset();
   preprocessingTime->reset();
   simplexTime->reset();
   syncTime->reset();
   transformTime->reset();
   rationalTime->reset();
   initialPrecisionTime->reset();
   extendedPrecisionTime->reset();
   reconstructionTime->reset();
   boostingStepTime->reset();
   multTimeSparse = 0.0;
   multTimeFull = 0.0;
   multTimeColwise = 0.0;
   multTimeUnsetup = 0.0;
   multSparseCalls = 0;
   multFullCalls = 0;
   multColwiseCalls = 0;
   multUnsetupCalls = 0;
   luFactorizationTimeReal = 0.0;
   luSolveTimeReal = 0.0;
   luFactorizationTimeRational = 0.0;
   luSolveTimeRational = 0.0;
   fpTime = 0.0;
   iterations = 0;
   iterationsPrimal = 0;
   iterationsFromBasis = 0;
   iterationsPolish = 0;
   iterationsFP = 0;
   boundflips = 0;
   boostedIterations = 0;
   boostedIterationsPrimal = 0;
   boostedIterationsFromBasis = 0;
   boostedIterationsPolish = 0;
   boostedBoundflips = 0;
   luFactorizationsReal = 0;
   luSolvesReal = 0;
   luFactorizationsRational = 0;
   rationalReconstructions = 0;
   refinements = 0;
   stallRefinements = 0;
   pivotRefinements = 0;
   feasRefinements = 0;
   unbdRefinements = 0;
   precBoosts = 0;
   stallPrecBoosts = 0;
   pivotPrecBoosts = 0;
   feasPrecBoosts = 0;
   unbdPrecBoosts = 0;

   callsReducedProb = 0;
   iterationsInit = 0;
   iterationsRedProb = 0;
   iterationsCompProb = 0;
   numRedProbRows = 0;
   numRedProbCols = 0;
   degenPivotsPrimal = 0;
   degenPivotsDual = 0;
   degenPivotCandPrimal = 0;
   degenPivotCandDual = 0;
   sumDualDegen = 0;
   sumPrimalDegen = 0;
   totalBoundViol = 0;
   totalRowViol = 0;
   maxBoundViol = 0;
   maxRowViol = 0;
   redProbStatus = 0;
   compProbStatus = 0;
   finalCompObj = 0;
   finalBasisCondition = 0;
}